

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::TablePrinter::close(TablePrinter *this,int __fd)

{
  int in_EAX;
  ostream *poVar1;
  
  if (this->m_isOpen == true) {
    if (0 < this->m_currentColumn) {
      std::operator<<(this->m_os,'\n');
      this->m_currentColumn = -1;
    }
    poVar1 = std::endl<char,std::char_traits<char>>(this->m_os);
    in_EAX = (int)poVar1;
    this->m_isOpen = false;
  }
  return in_EAX;
}

Assistant:

void close() {
      if (m_isOpen) {
        *this << RowBreak();
        m_os << std::endl;
        m_isOpen = false;
      }
    }